

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
resizeImpl<slang::IntervalMapDetails::Path::Entry>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,size_type newSize,
          Entry *val)

{
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer pEVar4;
  long lVar5;
  Entry temp;
  Entry local_18;
  
  uVar1 = this->len;
  lVar5 = newSize - uVar1;
  if (uVar1 <= newSize) {
    if (uVar1 <= newSize && lVar5 != 0) {
      if (this->cap < newSize) {
        local_18.node = val->node;
        local_18.size = val->size;
        local_18.offset = val->offset;
        resizeRealloc<slang::IntervalMapDetails::Path::Entry>(this,newSize,&local_18);
      }
      else {
        if (0 < lVar5) {
          pEVar4 = this->data_ + uVar1;
          lVar5 = lVar5 + 1;
          do {
            uVar2 = val->size;
            uVar3 = val->offset;
            pEVar4->node = val->node;
            pEVar4->size = uVar2;
            pEVar4->offset = uVar3;
            pEVar4 = pEVar4 + 1;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
        }
        this->len = newSize;
      }
      return;
    }
  }
  else {
    this->len = newSize;
  }
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }